

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall
FIX::IncorrectTagValue::IncorrectTagValue(IncorrectTagValue *this,int f,string *what)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Value is incorrect (out of range) for this tag",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,what);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_Exception = &PTR__Exception_00171158;
  this->field = f;
  return;
}

Assistant:

IncorrectTagValue( int f = 0, const std::string& what = "" )
    : Exception( "Value is incorrect (out of range) for this tag", what ),
                 field( f ) {}